

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::
RegisterTests(ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_>_>
  _Var5;
  char *pcVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  ulong uVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  long *plVar13;
  long *plVar14;
  testing *this_00;
  ostream *poVar15;
  size_t sVar16;
  const_iterator cVar17;
  char *pcVar18;
  undefined4 extraout_var;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  ulong uVar19;
  tuple<const_trust_token_method_st_*,_bool,_int,_bool> *value;
  pointer pIVar20;
  string param_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_name;
  ParamGenerator<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_> generator;
  GTestLog local_1d8;
  int local_1d4;
  long *local_1d0;
  pointer local_1c8;
  char *local_1c0;
  string local_1b8;
  string local_198;
  long *local_178;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest> *local_120;
  long local_118;
  char *local_110;
  undefined8 local_108;
  char local_100;
  undefined7 uStack_ff;
  string local_f0;
  long *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  CodeLocation local_c0;
  pointer local_98;
  pointer local_90;
  pointer local_88;
  ParamNameGeneratorFunc *local_80;
  char *local_78;
  CodeLocation local_70;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  local_170 = &local_160;
  local_168 = 0;
  local_160 = 0;
  local_110 = &local_100;
  local_108 = 0;
  local_100 = '\0';
  local_1c8 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8 != local_98) {
    bVar11 = false;
    local_120 = this;
    do {
      pIVar20 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_90 = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar20 != local_90) {
        do {
          (*pIVar20->generator)(&local_d0);
          local_80 = pIVar20->name_func;
          local_1c0 = pIVar20->file;
          local_1d4 = pIVar20->line;
          if ((pIVar20->name)._M_string_length == 0) {
            local_168 = 0;
            *local_170 = 0;
          }
          else {
            local_150._M_impl._0_8_ = &local_150._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar3 = (pIVar20->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,pcVar3,pcVar3 + (pIVar20->name)._M_string_length);
            std::__cxx11::string::append((char *)&local_150);
            std::__cxx11::string::operator=((string *)&local_170,(string *)&local_150);
            if ((_Base_ptr *)local_150._M_impl._0_8_ !=
                &local_150._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_150._M_impl._0_8_,
                              (ulong)((long)&(local_150._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_170,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_150._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_150._M_impl.super__Rb_tree_header._M_header;
          local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_150._M_impl.super__Rb_tree_header._M_header._M_right =
               local_150._M_impl.super__Rb_tree_header._M_header._M_left;
          local_88 = pIVar20;
          plVar13 = (long *)(**(code **)(*local_d0 + 0x10))();
          plVar14 = (long *)(**(code **)(*local_d0 + 0x18))();
          if (plVar13 != plVar14) {
            local_118 = 0;
            local_1d0 = plVar14;
            local_178 = plVar13;
            do {
              cVar10 = (**(code **)(*plVar13 + 0x30))(plVar13,local_1d0);
              plVar14 = local_1d0;
              if (cVar10 != '\0') break;
              this_00 = (testing *)(**(code **)(*plVar13 + 0x28))(plVar13);
              local_108 = 0;
              *local_110 = '\0';
              local_1b8.field_2._M_allocated_capacity = *(undefined8 *)(this_00 + 0x10);
              local_1b8._M_dataplus._M_p = *(pointer *)this_00;
              local_1b8._M_string_length = *(size_type *)(this_00 + 8);
              local_1b8.field_2._8_8_ = local_118;
              (*local_80)(&local_198,
                          (TestParamInfo<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>
                           *)&local_1b8);
              sVar8 = local_198._M_string_length;
              _Var7._M_p = local_198._M_dataplus._M_p;
              if (local_198._M_string_length == 0) {
                bVar11 = false;
              }
              else {
                bVar2 = *local_198._M_dataplus._M_p;
                iVar12 = isalnum((uint)bVar2);
                if ((bVar2 == 0x5f) || (iVar12 != 0)) {
                  uVar9 = 1;
                  do {
                    uVar19 = uVar9;
                    if (sVar8 == uVar19) break;
                    bVar2 = _Var7._M_p[uVar19];
                    iVar12 = isalnum((uint)bVar2);
                    uVar9 = uVar19 + 1;
                  } while ((bVar2 == 0x5f) || (iVar12 != 0));
                  bVar11 = sVar8 <= uVar19;
                }
                else {
                  bVar11 = false;
                }
              }
              bVar11 = IsTrue(bVar11);
              if (!bVar11) {
                GTestLog::GTestLog((GTestLog *)&local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_198._M_dataplus._M_p,
                                     local_198._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                pcVar18 = local_1c0;
                if (local_1c0 == (char *)0x0) {
                  std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
                }
                else {
                  sVar16 = strlen(local_1c0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar18,sVar16);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," line ",6);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_1d4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
                std::ostream::put((char)poVar15);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1b8);
              }
              cVar17 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_150,&local_198);
              bVar11 = IsTrue((_Rb_tree_header *)cVar17._M_node ==
                              &local_150._M_impl.super__Rb_tree_header);
              if (!bVar11) {
                GTestLog::GTestLog((GTestLog *)&local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_198._M_dataplus._M_p,
                                     local_198._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\', in ",6);
                pcVar18 = local_1c0;
                if (local_1c0 == (char *)0x0) {
                  std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
                }
                else {
                  sVar16 = strlen(local_1c0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar18,sVar16);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," line ",6);
                plVar13 = (long *)std::ostream::operator<<(poVar15,local_1d4);
                std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
                std::ostream::put((char)plVar13);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1b8);
              }
              peVar4 = (local_1c8->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar18 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_110,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar18);
              }
              std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_198._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_150,&local_198);
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,local_170,local_170 + local_168);
              pcVar18 = local_110;
              PrintToString<std::tuple<trust_token_method_st_const*,bool,int,bool>>
                        (&local_1b8,this_00,value);
              _Var7._M_p = local_1b8._M_dataplus._M_p;
              peVar4 = (local_1c8->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_c0.file._M_dataplus._M_p = (pointer)&local_c0.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              plVar13 = local_178;
              local_78 = _Var7._M_p;
              local_c0.line = (peVar4->code_location).line;
              iVar12 = (*(local_120->super_ParameterizedTestSuiteInfoBase).
                         _vptr_ParameterizedTestSuiteInfoBase[3])();
              bVar11 = IsTrue(true);
              if (!bVar11) {
                GTestLog::GTestLog(&local_1d8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x201);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                           ,0x6a);
                pcVar6 = local_1c0;
                if (local_1c0 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x72b7a0);
                }
                else {
                  sVar16 = strlen(local_1c0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar6,sVar16);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,local_1d4);
                GTestLog::~GTestLog(&local_1d8);
              }
              bVar11 = IsTrue(true);
              if (!bVar11) {
                GTestLog::GTestLog(&local_1d8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x216);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                           ,0x6f);
                pcVar6 = local_1c0;
                if (local_1c0 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x72b7a0);
                }
                else {
                  sVar16 = strlen(local_1c0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar6,sVar16);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,local_1d4);
                GTestLog::~GTestLog(&local_1d8);
              }
              _Var5.
              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_false>
              ._M_head_impl =
                   (((local_1c8->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->test_meta_factory)._M_t.
                   super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_>_>
                   .
                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_false>
              ;
              local_38 = *(undefined8 *)(this_00 + 0x10);
              local_48 = *(undefined4 *)this_00;
              uStack_44 = *(undefined4 *)(this_00 + 4);
              uStack_40 = *(undefined4 *)(this_00 + 8);
              uStack_3c = *(undefined4 *)(this_00 + 0xc);
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)_Var5.
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_false>
                                              ._M_head_impl + 0x10))
                                  (_Var5.
                                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_false>
                                   ._M_head_impl,&local_48);
              MakeAndRegisterTestInfo
                        (&local_f0,pcVar18,(char *)0x0,local_78,&local_c0,
                         (TypeId)CONCAT44(extraout_var,iVar12),(SetUpTestSuiteFunc)0x0,
                         (TearDownTestSuiteFunc)0x0,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0.file._M_dataplus._M_p != &local_c0.file.field_2) {
                operator_delete(local_c0.file._M_dataplus._M_p,
                                local_c0.file.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                operator_delete(local_1b8._M_dataplus._M_p,
                                local_1b8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
              (**(code **)(*plVar13 + 0x18))(plVar13);
              local_118 = local_118 + 1;
              bVar11 = true;
              plVar14 = local_1d0;
            } while (plVar13 != local_1d0);
          }
          this = local_120;
          if (plVar14 != (long *)0x0) {
            (**(code **)(*plVar14 + 8))(plVar14);
          }
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 8))(plVar13);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_150);
          if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
          }
          pIVar20 = local_88 + 1;
        } while (pIVar20 != local_90);
      }
      local_1c8 = local_1c8 + 1;
    } while (local_1c8 != local_98);
    if (bVar11) goto LAB_003a52c9;
  }
  iVar12 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                     (this);
  paVar1 = &local_70.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_70.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_70.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar12),&local_70,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.file._M_dataplus._M_p,local_70.file.field_2._M_allocated_capacity + 1);
  }
LAB_003a52c9:
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }